

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void NodeReportError(anynode *AnyNode,node *Sender,fourcc_t Class,int No,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list Args;
  nodecontext *Context;
  int No_local;
  fourcc_t Class_local;
  node *Sender_local;
  anynode *AnyNode_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (AnyNode != (anynode *)0x0) {
    lVar1 = **(long **)((long)AnyNode + 8);
    if (*(long *)(lVar1 + 0xc0) != 0) {
      Args[0].overflow_arg_area = local_f8;
      Args[0]._0_8_ = &stack0x00000008;
      local_44 = 0x30;
      local_48 = 0x20;
      (**(code **)(lVar1 + 0xc0))(lVar1,Sender,Class,No,&local_48);
    }
    return;
  }
  __assert_fail("(const void*)(AnyNode)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xb01,"void NodeReportError(anynode *, node *, fourcc_t, int, ...)");
}

Assistant:

void NodeReportError(anynode* AnyNode, node* Sender, fourcc_t Class, int No,...)
{
    nodecontext* Context = Node_Context(AnyNode);
    if (Context->ReportError)
    {
        va_list Args;
        va_start(Args,No);
        Context->ReportError(Context,Sender,Class,No,Args);
        va_end(Args);
    }
}